

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitWhileStatement(SyntaxDumper *this,WhileStatementSyntax *node)

{
  ExpressionSyntax *pEVar1;
  StatementSyntax *pSVar2;
  WhileStatementSyntax local_d0 [56];
  WhileStatementSyntax local_98 [72];
  WhileStatementSyntax local_50 [56];
  WhileStatementSyntax *local_18;
  WhileStatementSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (WhileStatementSyntax *)this;
  WhileStatementSyntax::whileKeyword(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  WhileStatementSyntax::openParenthesisToken(local_98);
  (**(code **)(*(long *)this + 0x2e8))(this,local_98,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_98);
  pEVar1 = WhileStatementSyntax::condition(local_18);
  (**(code **)(*(long *)this + 0x2f0))(this,pEVar1);
  WhileStatementSyntax::closeParenthesisToken(local_d0);
  (**(code **)(*(long *)this + 0x2e8))(this,local_d0,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_d0);
  pSVar2 = WhileStatementSyntax::statement(local_18);
  (**(code **)(*(long *)this + 0x2f0))(this,pSVar2);
  return Skip;
}

Assistant:

virtual Action visitWhileStatement(const WhileStatementSyntax* node) override
    {
        terminal(node->whileKeyword(), node);
        terminal(node->openParenthesisToken(), node);
        nonterminal(node->condition());
        terminal(node->closeParenthesisToken(), node);
        nonterminal(node->statement());
        return Action::Skip;
    }